

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O1

void fmt::v7::vprint<char>
               (basic_ostream<char,_std::char_traits<char>_> *os,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  buffer<char> local_248;
  char local_228 [504];
  
  local_248.size_ = 0;
  local_248._vptr_buffer = (_func_int **)&PTR_grow_00144620;
  local_248.capacity_ = 500;
  local_248.ptr_ = local_228;
  detail::vformat_to<char>(&local_248,format_str,args,(locale_ref)0x0);
  sVar1 = local_248.size_;
  pcVar2 = local_248.ptr_;
  do {
    uVar3 = 0x7fffffffffffffff;
    if (sVar1 < 0x7fffffffffffffff) {
      uVar3 = sVar1;
    }
    std::ostream::write((char *)os,(long)pcVar2);
    pcVar2 = pcVar2 + uVar3;
    sVar1 = sVar1 - uVar3;
  } while (sVar1 != 0);
  if (local_248.ptr_ != local_228) {
    operator_delete(local_248.ptr_,local_248.capacity_);
  }
  return;
}

Assistant:

void vprint(std::basic_ostream<Char>& os, basic_string_view<Char> format_str,
            basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  basic_memory_buffer<Char> buffer;
  detail::vformat_to(buffer, format_str, args);
  detail::write_buffer(os, buffer);
}